

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

char __thiscall anon_unknown.dwarf_c2e5d7::NumericTokenizer::nextToken(NumericTokenizer *this)

{
  QStringView *pQVar1;
  storage_type_conflict sVar2;
  NumberMode NVar3;
  char32_t cVar4;
  long lVar5;
  storage_type_conflict *psVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  qsizetype qVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  QStringView needle;
  QStringView rhs;
  QStringView rhs_00;
  QStringView needle_00;
  QStringView needle_01;
  QStringView haystack;
  QStringView haystack_00;
  QStringView haystack_01;
  QStringView haystack0;
  QStringView haystack_02;
  QStringView haystack_03;
  QStringView lhs;
  QStringView lhs_00;
  QStringView haystack_04;
  QStringView haystack_05;
  
  lVar5 = this->m_index;
  psVar6 = (this->m_text).m_data;
  sVar2 = psVar6[lVar5];
  uVar14 = (uint)(ushort)sVar2;
  if (sVar2 == L'−') {
    this->m_index = lVar5 + 1;
    return '-';
  }
  if ((this->m_guide).isC == true) {
    this->m_index = lVar5 + 1;
    if (uVar14 < 0x100) {
      uVar13 = uVar14 | 0x20;
      if ((ushort)sVar2 < 0x41) {
        uVar13 = uVar14;
      }
      cVar12 = (char)uVar13;
      if (uVar13 - 0x30 < 10) {
        return cVar12;
      }
      if ((0x2a < uVar13) && ((int)uVar13 <= (int)this->lastMark)) {
        return cVar12;
      }
      if (this->m_mode != IntegerMode) {
        if ((uVar13 - 0x61 < 0x20) && ((1 << ((byte)(uVar13 - 0x61) & 0x1f) & 0x2121U) != 0)) {
          return cVar12;
        }
        if (uVar13 == 0x65 && this->m_mode == DoubleScientificMode) {
          return 'e';
        }
      }
    }
    goto LAB_003126cd;
  }
  lVar7 = (this->m_text).m_size;
  if ((ushort)sVar2 < 0x100) {
    uVar13 = uVar14 | 0x20;
    if ((ushort)sVar2 < 0x41) {
      uVar13 = uVar14;
    }
    cVar12 = (char)uVar13;
    if (((((int)cVar12 - 0x30U < 10) || (cVar12 == '+')) || ((uVar13 & 0xff) == 0x2d)) ||
       (((this->m_mode != IntegerMode && (uVar13 - 0x61 < 0x20)) &&
        ((1 << ((byte)(uVar13 - 0x61) & 0x1f) & 0x2121U) != 0)))) {
      this->m_index = lVar5 + 1;
      return cVar12;
    }
  }
  psVar6 = psVar6 + lVar5;
  lVar16 = lVar7 - lVar5;
  pQVar1 = &(this->m_guide).minus;
  lVar8 = pQVar1->m_size;
  haystack.m_data = psVar6;
  haystack.m_size = lVar16;
  bVar10 = QtPrivate::startsWith(haystack,*pQVar1,CaseSensitive);
  if (bVar10) {
    this->m_index = lVar8 + lVar5;
    return '-';
  }
  pQVar1 = &(this->m_guide).plus;
  lVar8 = pQVar1->m_size;
  haystack_00.m_data = psVar6;
  haystack_00.m_size = lVar16;
  bVar10 = QtPrivate::startsWith(haystack_00,*pQVar1,CaseSensitive);
  if (bVar10) {
    this->m_index = lVar8 + lVar5;
    return '+';
  }
  lVar8 = (this->m_guide).group.m_size;
  if ((lVar8 != 0) &&
     (needle.m_data = (this->m_guide).group.m_data, needle.m_size = lVar8,
     haystack_01.m_data = psVar6, haystack_01.m_size = lVar16,
     bVar10 = QtPrivate::startsWith(haystack_01,needle,CaseSensitive), bVar10)) {
    this->m_index = lVar5 + lVar8;
    bVar10 = fractionGroupClash(this);
    if (!bVar10) {
      return ',';
    }
    haystack0.m_data = psVar6;
    haystack0.m_size = lVar16;
    qVar11 = QtPrivate::findString(haystack0,lVar8,(this->m_guide).decimal,CaseSensitive);
    if (qVar11 != -1) {
      return ',';
    }
    return '.';
  }
  NVar3 = this->m_mode;
  if (NVar3 == IntegerMode) {
LAB_003124f6:
    if ((this->m_guide).zeroLen == '\x01') {
      if ((uVar14 & 0xf800) == 0xd800) {
        if ((lVar16 < 2 || (uVar14 & 0xdc00) != 0xd800) || ((psVar6[1] & 0xfc00U) != 0xdc00))
        goto LAB_003125f4;
      }
      else {
        cVar4 = (this->m_guide).zeroUcs;
        if (cVar4 == L'〇') {
          if (uVar14 == 0x3020) goto LAB_003125f4;
          if (uVar14 == 0x3007) goto LAB_003125e4;
          uVar13 = uVar14 - 0x3020;
        }
        else {
LAB_003125e4:
          uVar13 = uVar14 - cVar4;
        }
        if (uVar13 < 10) {
          this->m_index = lVar5 + 1;
          return (byte)uVar13 | 0x30;
        }
LAB_003125f4:
        if (lVar8 == 1) {
          rhs.m_data = L"\xa0";
          rhs.m_size = 1;
          lhs.m_data = (this->m_guide).group.m_data;
          lhs.m_size = 1;
          bVar10 = QtPrivate::equalStrings(lhs,rhs);
          if (bVar10) {
            if ((lVar7 != lVar5) && (sVar2 == L' ')) {
LAB_00312659:
              this->m_index = lVar5 + 1;
              return ',';
            }
          }
          else {
            rhs_00.m_data = L"\x202f";
            rhs_00.m_size = 1;
            lhs_00.m_data = (this->m_guide).group.m_data;
            lhs_00.m_size = 1;
            bVar10 = QtPrivate::equalStrings(lhs_00,rhs_00);
            if (((uVar14 == 0x20) && (bVar10)) && (lVar7 != lVar5)) goto LAB_00312659;
          }
        }
        if ((this->m_guide).exponentCyrillic == true) {
          needle_00.m_data = L"Е";
          needle_00.m_size = 1;
          haystack_04.m_data = psVar6;
          haystack_04.m_size = lVar16;
          bVar10 = QtPrivate::startsWith(haystack_04,needle_00,CaseInsensitive);
          if ((!bVar10) &&
             (needle_01.m_data = L"E", needle_01.m_size = 1, haystack_05.m_data = psVar6,
             haystack_05.m_size = lVar16,
             bVar10 = QtPrivate::startsWith(haystack_05,needle_01,CaseInsensitive), !bVar10)) {
            return '\0';
          }
          this->m_index = lVar5 + 1;
          goto LAB_003126c5;
        }
      }
    }
    else {
      if ((uVar14 & 0xfc00) != 0xd800) goto LAB_003125f4;
      if (1 < lVar16) {
        sVar2 = psVar6[1];
        if (((ushort)sVar2 & 0xfc00) != 0xdc00) {
          return '\0';
        }
        this->m_index = lVar5 + 2;
        iVar15 = (uVar14 * 0x400 + (uint)(ushort)sVar2) - (this->m_guide).zeroUcs;
        if (iVar15 + 0xfca02400U < 10) {
          return (char)iVar15 + '0';
        }
        return '\0';
      }
    }
LAB_003126cd:
    cVar12 = '\0';
  }
  else {
    pQVar1 = &(this->m_guide).decimal;
    lVar9 = pQVar1->m_size;
    haystack_02.m_data = psVar6;
    haystack_02.m_size = lVar16;
    bVar10 = QtPrivate::startsWith(haystack_02,*pQVar1,CaseSensitive);
    if (bVar10) {
      this->m_index = lVar9 + lVar5;
      return '.';
    }
    if (NVar3 != DoubleScientificMode) goto LAB_003124f6;
    pQVar1 = &(this->m_guide).exponent;
    lVar9 = pQVar1->m_size;
    haystack_03.m_data = psVar6;
    haystack_03.m_size = lVar16;
    bVar10 = QtPrivate::startsWith(haystack_03,*pQVar1,CaseInsensitive);
    if (!bVar10) goto LAB_003124f6;
    this->m_index = lVar9 + lVar5;
LAB_003126c5:
    cVar12 = 'e';
  }
  return cVar12;
}

Assistant:

char NumericTokenizer::nextToken()
{
    // As long as caller stops iterating on a zero return, those don't need to
    // keep m_index correctly updated.
    Q_ASSERT(!done());
    // Mauls non-letters above 'Z' but we don't care:
    const auto asciiLower = [](unsigned char c) { return c >= 'A' ? c | 0x20 : c; };
    const QStringView tail = m_text.sliced(m_index);
    const QChar ch = tail.front();
    if (ch == u'\u2212') {
        // Special case: match the "proper" minus sign, for all locales.
        ++m_index;
        return '-';
    }
    if (m_guide.isC) {
        // "Conversion" to C locale is just a filter:
        ++m_index;
        if (Q_LIKELY(ch.unicode() < 256)) {
            unsigned char ascii = asciiLower(ch.toLatin1());
            if (Q_LIKELY(isAsciiDigit(ascii) || ('+' <= ascii && ascii <= lastMark)
                         // No caller presently (6.5) passes DoubleStandardMode,
                         // so !IntegerMode implies scientific, for now.
                         || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))
                         || (m_mode == QLocaleData::DoubleScientificMode && ascii == 'e'))) {
                return ascii;
            }
        }
        return 0;
    }
    if (ch.unicode() < 256) {
        // Accept the C locale's digits and signs in all locales:
        char ascii = asciiLower(ch.toLatin1());
        if (isAsciiDigit(ascii) || ascii == '-' || ascii == '+'
            // Also its Inf and NaN letters:
            || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))) {
            ++m_index;
            return ascii;
        }
    }

    // Other locales may be trickier:
    if (tail.startsWith(m_guide.minus)) {
        m_index += m_guide.minus.size();
        return '-';
    }
    if (tail.startsWith(m_guide.plus)) {
        m_index += m_guide.plus.size();
        return '+';
    }
    if (!m_guide.group.isEmpty() && tail.startsWith(m_guide.group)) {
        m_index += m_guide.group.size();
        // When group and decimal coincide, and a fractional part is not
        // unexpected, treat the last as a fractional part separator (and leave
        // the caller to special-case the situations where that causes a
        // parse-fail that we can dodge by not reading it that way).
        if (fractionGroupClash() && tail.indexOf(m_guide.decimal, m_guide.group.size()) == -1)
            return '.';
        return ',';
    }
    if (m_mode != QLocaleData::IntegerMode && tail.startsWith(m_guide.decimal)) {
        m_index += m_guide.decimal.size();
        return '.';
    }
    if (m_mode == QLocaleData::DoubleScientificMode
        && tail.startsWith(m_guide.exponent, Qt::CaseInsensitive)) {
        m_index += m_guide.exponent.size();
        return 'e';
    }

    // Must match qlocale_tools.h's unicodeForDigit()
    if (m_guide.zeroLen == 1) {
        if (!ch.isSurrogate()) {
            const uint gap = asBmpDigit(ch.unicode());
            if (gap < 10u) {
                ++m_index;
                return '0' + gap;
            }
        } else if (ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()) {
            return 0;
        }
    } else if (ch.isHighSurrogate()) {
        // None of the corner cases below matches a surrogate, so (update
        // already and) return early if we don't have a digit.
        if (tail.size() > 1) {
            QChar low = tail.at(1);
            if (low.isLowSurrogate()) {
                m_index += 2;
                const uint gap = QChar::surrogateToUcs4(ch, low) - m_guide.zeroUcs;
                return gap < 10u ? '0' + gap : 0;
            }
        }
        return 0;
    }

    // All cases where tail starts with properly-matched surrogate pair
    // have been handled by this point.
    Q_ASSERT(!(ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()));

    // Weird corner cases follow (code above assumes these match no surrogates).

    // Some locales use a non-breaking space (U+00A0) or its thin version
    // (U+202f) for grouping. These look like spaces, so people (and thus some
    // of our tests) use a regular space instead and complain if it doesn't
    // work.
    // Should this be extended generally to any case where group is a space ?
    if ((m_guide.group == u"\u00a0" || m_guide.group == u"\u202f") && tail.startsWith(u' ')) {
        ++m_index;
        return ',';
    }

    // Cyrillic has its own E, used by Ukrainian as exponent; but others
    // writing Cyrillic may well use that; and Ukrainians might well use E.
    // All other Cyrillic locales (officially) use plain ASCII E.
    if (m_guide.exponentCyrillic // Only true in scientific float mode.
        && (tail.startsWith(u"\u0415", Qt::CaseInsensitive)
            || tail.startsWith(u"E", Qt::CaseInsensitive))) {
        ++m_index;
        return 'e';
    }

    return 0;
}